

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

ostream * wasm::operator<<(ostream *o,Literal *literal)

{
  Type *this;
  array<wasm::Literal,_1UL> *this_00;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *this_01;
  uintptr_t uVar1;
  HeapType HVar2;
  bool bVar3;
  int32_t iVar4;
  ostream *poVar5;
  int64_t iVar6;
  char *in_RCX;
  long lVar7;
  long lVar8;
  char *pcVar9;
  Literal *other;
  long lVar10;
  long lVar11;
  Name NVar12;
  Name name;
  Literals local_b0;
  HeapType local_78;
  HeapType heapType;
  value_type c;
  undefined1 local_48 [8];
  shared_ptr<wasm::GCData> data;
  
  Colors::outputColorCode(o,"\x1b[33m");
  if ((literal->type).id < 2) {
LAB_00936aa5:
    __assert_fail("literal.type.isSingle()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0x221,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
  }
  this = &literal->type;
  bVar3 = Type::isTuple(this);
  if (bVar3) goto LAB_00936aa5;
  uVar1 = this->id;
  poVar5 = o;
  switch(uVar1) {
  case 0:
    pcVar9 = "?";
    lVar7 = 1;
    goto LAB_00936983;
  case 1:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                       ,0x238);
  case 2:
    if (uVar1 != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    std::ostream::operator<<(o,(literal->field_0).i32);
    break;
  case 3:
    if (uVar1 != 3) {
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x121,"int64_t wasm::Literal::geti64() const");
    }
    std::ostream::_M_insert<long>((long)o);
    break;
  case 4:
    if (uVar1 != 4) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x125,"float wasm::Literal::getf32() const");
    }
    Literal::printFloat(o,(float)(literal->field_0).i32);
    break;
  case 5:
    if (uVar1 != 5) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x129,"double wasm::Literal::getf64() const");
    }
    Literal::printDouble(o,(double)(literal->field_0).i64);
    break;
  case 6:
    std::__ostream_insert<char,std::char_traits<char>>(o,"i32x4 ",6);
    _heapType = (Name)Literal::getv128(literal);
    Literal::printVec128(o,(array<unsigned_char,_16UL> *)&heapType);
    break;
  default:
    bVar3 = Type::isRef(this);
    if (!bVar3) {
      __assert_fail("literal.type.isRef()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x23b,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
    }
    local_78 = Type::getHeapType(this);
    switch(local_78.id) {
    case 0:
      pcVar9 = "externref";
      lVar7 = 9;
      break;
    case 1:
    case 2:
    case 3:
    case 5:
    case 6:
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x253);
    case 4:
      std::__ostream_insert<char,std::char_traits<char>>(o,"i31ref(",7);
      iVar4 = Literal::geti31(literal,true);
      poVar5 = (ostream *)std::ostream::operator<<(o,iVar4);
      goto LAB_00936955;
    case 7:
      Literal::getGCData((Literal *)local_48);
      lVar7 = CONCAT71(local_48._1_7_,local_48[0]);
      if (lVar7 == 0) {
        lVar8 = 10;
        pcVar9 = "nullstring";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(o,"string(\"",8);
        lVar8 = 2;
        pcVar9 = "\")";
        lVar11 = (*(long *)(lVar7 + 0x30) - *(long *)(lVar7 + 0x28) >> 3) * -0x5555555555555555 +
                 *(long *)(lVar7 + 8);
        if (lVar11 != 0) {
          lVar10 = -0x18;
          lVar8 = 0;
          do {
            other = (Literal *)(*(long *)(lVar7 + 0x28) + lVar10);
            if (lVar8 == 0) {
              other = (Literal *)(lVar7 + 0x10);
            }
            Literal::Literal((Literal *)&heapType,other);
            iVar6 = Literal::getInteger((Literal *)&heapType);
            data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _7_1_ = (undefined1)iVar6;
            std::__ostream_insert<char,std::char_traits<char>>
                      (o,(char *)((long)&data.
                                         super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi + 7),1);
            Literal::~Literal((Literal *)&heapType);
            lVar8 = lVar8 + 1;
            lVar10 = lVar10 + 0x18;
          } while (lVar11 != lVar8);
          lVar8 = 2;
          pcVar9 = "\")";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,pcVar9,lVar8);
LAB_00936a92:
      if (data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      goto LAB_00936988;
    case 8:
    case 9:
    case 10:
      handle_unreachable("TODO: string literals",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x265);
    case 0xb:
      pcVar9 = "nullref";
      lVar7 = 7;
      break;
    case 0xc:
      pcVar9 = "nullexternref";
      lVar7 = 0xd;
      break;
    case 0xd:
      pcVar9 = "nullfuncref";
      lVar7 = 0xb;
      break;
    default:
      bVar3 = HeapType::isSignature(&local_78);
      if (!bVar3) {
        bVar3 = Type::isData(this);
        if (!bVar3) {
          __assert_fail("literal.isData()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                        ,0x26a,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
        }
        Literal::getGCData((Literal *)&heapType);
        HVar2.id = heapType.id;
        if (heapType.id == 0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                        ,0x26c,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
        }
        std::__ostream_insert<char,std::char_traits<char>>(o,"[ref ",5);
        poVar5 = operator<<(o,(HeapType)*HVar2.id);
        local_48[0] = ' ';
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_48,1);
        local_b0.super_SmallVector<wasm::Literal,_1UL>.usedFixed = *(size_t *)(HVar2.id + 8);
        this_00 = &local_b0.super_SmallVector<wasm::Literal,_1UL>.fixed;
        Literal::Literal(this_00->_M_elems,(Literal *)(HVar2.id + 0x10));
        this_01 = &local_b0.super_SmallVector<wasm::Literal,_1UL>.flexible;
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                  (this_01,(vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                           (HVar2.id + 0x28));
        poVar5 = operator<<(poVar5,&local_b0);
        local_48[0] = ']';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_48,1);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(this_01);
        Literal::~Literal(this_00->_M_elems);
        data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)c.field_0.i64;
        goto LAB_00936a92;
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,"funcref(",8);
      NVar12 = Literal::getFunc(literal);
      name.super_IString.str._M_len = NVar12.super_IString.str._M_str;
      name.super_IString.str._M_str = in_RCX;
      poVar5 = operator<<((wasm *)o,NVar12.super_IString.str._M_len,name);
LAB_00936955:
      pcVar9 = ")";
      lVar7 = 1;
    }
LAB_00936983:
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar7);
  }
LAB_00936988:
  Colors::outputColorCode(o,"\x1b[0m");
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, Literal literal) {
  prepareMinorColor(o);
  assert(literal.type.isSingle());
  if (literal.type.isBasic()) {
    switch (literal.type.getBasic()) {
      case Type::none:
        o << "?";
        break;
      case Type::i32:
        o << literal.geti32();
        break;
      case Type::i64:
        o << literal.geti64();
        break;
      case Type::f32:
        literal.printFloat(o, literal.getf32());
        break;
      case Type::f64:
        literal.printDouble(o, literal.getf64());
        break;
      case Type::v128:
        o << "i32x4 ";
        literal.printVec128(o, literal.getv128());
        break;
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  } else {
    assert(literal.type.isRef());
    auto heapType = literal.type.getHeapType();
    if (heapType.isBasic()) {
      switch (heapType.getBasic()) {
        case HeapType::i31:
          o << "i31ref(" << literal.geti31() << ")";
          break;
        case HeapType::none:
          o << "nullref";
          break;
        case HeapType::noext:
          o << "nullexternref";
          break;
        case HeapType::nofunc:
          o << "nullfuncref";
          break;
        case HeapType::ext:
          o << "externref";
          break;
        case HeapType::any:
        case HeapType::eq:
        case HeapType::func:
        case HeapType::struct_:
        case HeapType::array:
          WASM_UNREACHABLE("invalid type");
        case HeapType::string: {
          auto data = literal.getGCData();
          if (!data) {
            o << "nullstring";
          } else {
            o << "string(\"";
            for (auto c : data->values) {
              // TODO: more than ascii
              o << char(c.getInteger());
            }
            o << "\")";
          }
          break;
        }
        case HeapType::stringview_wtf8:
        case HeapType::stringview_wtf16:
        case HeapType::stringview_iter:
          WASM_UNREACHABLE("TODO: string literals");
      }
    } else if (heapType.isSignature()) {
      o << "funcref(" << literal.getFunc() << ")";
    } else {
      assert(literal.isData());
      auto data = literal.getGCData();
      assert(data);
      o << "[ref " << data->type << ' ' << data->values << ']';
    }
  }
  restoreNormalColor(o);
  return o;
}